

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O2

int main(int argc,char **arg)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  char *__s;
  VideoCapture capture;
  Mat frame;
  Mat local_280 [96];
  ofstream ofs;
  
  cv::VideoCapture::VideoCapture(&capture,0,0);
  cv::Mat::Mat(&frame);
  cVar1 = cv::CascadeClassifier::load((string *)hand_classifier);
  if (cVar1 == '\0') {
    __s = "--(!)Error loading";
  }
  else {
    cVar1 = cv::CascadeClassifier::load((string *)fist_classifier);
    if ((cVar1 != '\0') &&
       (cVar1 = cv::CascadeClassifier::load((string *)face_classifier), cVar1 != '\0')) {
      puts("done!");
      do {
        cv::VideoCapture::operator>>(&capture,&frame);
        cVar1 = cv::Mat::empty();
        if (cVar1 != '\0') {
          printf(" --(!) No captured frame -- Break!");
          break;
        }
        cv::Mat::Mat(local_280,&frame);
        detectAndDisplay(local_280);
        cv::Mat::~Mat(local_280);
        cVar1 = cv::waitKey(10);
      } while (cVar1 != 'q');
      std::ofstream::close();
      poVar2 = std::operator<<((ostream *)&std::cout,"cmae");
      std::operator<<(poVar2,"\n");
      std::ofstream::ofstream(&ofs);
      std::ofstream::open((char *)&ofs,0x10308f);
      std::ofstream::close();
      std::ofstream::~ofstream(&ofs);
      iVar3 = 0;
      goto LAB_00102596;
    }
    __s = " Error ";
  }
  puts(__s);
  iVar3 = -1;
LAB_00102596:
  cv::Mat::~Mat(&frame);
  cv::VideoCapture::~VideoCapture(&capture);
  return iVar3;
}

Assistant:

int main( int argc, const char** arg )
 {
   //char filename[] = "out.txt"
   //freopen ("out.txt", "w", stdout);
   VideoCapture capture(0);

   Mat frame;
   //-- 1. Load the cascades
   if(  !hand_classifier.load( hand_cascade_name ) ){ printf("--(!)Error loading\n"); return -1; }
   if ( !fist_classifier.load( fist_cascade_name) ) { printf(" Error \n"); return -1; }
   if ( !face_classifier.load( face_cascade_name)) { printf(" Error \n"); return -1; }
//   if ( !left_classifier.load( left_cascade_name)) { printf(" Error \n"); return -1; }
   else printf("done!\n");
   //-- 2. Read the video stream
     while( true )
     {
        capture >> frame;
   //-- 3. Apply the classifier to the frame
       if( !frame.empty() )
       { 
           detectAndDisplay( frame );
       }
       else
       { 
         printf(" --(!) No captured frame -- Break!"); break; 
       }
       int c = waitKey(10);
       if( (char)c == 'q' ) { break; }
       //if( (char)c == 'c' ) { goto L1; }
      }

      outfile.close();
      cout<<"cmae"<<"\n";
      //outfile2.close();
      //outfile3.close();
      //if (remove("out.txt")!=0) perror("File deletion failed");
      //else cout << "File deleted successfully"; 
      std::ofstream ofs;
      ofs.open("out.txt", std::ofstream::out | std::ofstream::trunc);
      ofs.close();
      //remove("fist.txt");
      //remove("face.txt");
      //fclose (stdout);
   return 0; 
 }